

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[34],unsigned_int,char[33],unsigned_int,char[56],unsigned_int,char[77]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [34],uint *Args_1,
          char (*Args_2) [33],uint *Args_3,char (*Args_4) [56],uint *Args_5,char (*Args_6) [77])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [56];
  uint *Args_local_3;
  char (*Args_local_2) [33];
  uint *Args_local_1;
  char (*Args_local) [34];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[34],unsigned_int,char[33],unsigned_int,char[56],unsigned_int,char[77]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [34])this,(uint *)Args,(char (*) [33])Args_1,(uint *)Args_2,
             (char (*) [56])Args_3,(uint *)Args_4,(char (*) [77])Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}